

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O2

REF_STATUS ref_collapse_pass(REF_GRID ref_grid)

{
  REF_DBL *pRVar1;
  uint node0;
  REF_NODE ref_node;
  REF_CELL pRVar2;
  REF_ADJ pRVar3;
  uint uVar4;
  REF_CELL *ppRVar5;
  REF_DBL *original;
  long lVar6;
  void *pvVar7;
  REF_INT *sorted_index;
  ulong uVar8;
  REF_ADJ_ITEM pRVar9;
  ulong uVar10;
  REF_INT RVar11;
  char *pcVar12;
  REF_STATUS RVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  REF_NODE pRVar17;
  double dVar18;
  undefined8 uStack_100;
  int local_e4;
  void *local_e0;
  REF_CELL local_d8;
  REF_EDGE ref_edge;
  REF_INT *local_c8;
  ulong local_c0;
  ulong local_b8;
  REF_DBL edge_ratio;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  ppRVar5 = ref_grid->cell + 3;
  if (ref_grid->surf == 0) {
    ppRVar5 = ref_grid->cell + 8;
  }
  pRVar2 = *ppRVar5;
  uVar4 = ref_edge_create(&ref_edge,ref_grid);
  if (uVar4 != 0) {
    pcVar12 = "orig edges";
    uStack_100 = 0x68;
LAB_00157384:
    uVar8 = (ulong)uVar4;
LAB_00157385:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           uStack_100,"ref_collapse_pass",uVar8,pcVar12);
    return (REF_STATUS)uVar8;
  }
  lVar14 = (long)ref_node->max;
  if (lVar14 < 0) {
    pcVar12 = "malloc ratio of REF_DBL negative";
    uStack_100 = 0x6b;
LAB_00157473:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           uStack_100,"ref_collapse_pass",pcVar12);
    RVar13 = 1;
  }
  else {
    original = (REF_DBL *)malloc(lVar14 * 8);
    if (original == (REF_DBL *)0x0) {
      pcVar12 = "malloc ratio of REF_DBL NULL";
      uStack_100 = 0x6b;
    }
    else {
      for (lVar6 = 0; lVar14 != lVar6; lVar6 = lVar6 + 1) {
        dVar18 = ref_grid->adapt->collapse_ratio;
        original[lVar6] = dVar18 + dVar18;
      }
      pRVar17 = ref_node;
      local_d8 = pRVar2;
      for (lVar14 = 0; lVar14 < ref_edge->n; lVar14 = lVar14 + 1) {
        node0 = ref_edge->e2n[lVar14 * 2];
        pRVar17 = (REF_NODE)(ulong)node0;
        RVar11 = ref_edge->e2n[lVar14 * 2 + 1];
        uVar4 = ref_node_ratio(ref_node,node0,RVar11,&edge_ratio);
        if (uVar4 != 0) {
          pcVar12 = "ratio";
          uStack_100 = 0x70;
          goto LAB_00157384;
        }
        dVar18 = original[(int)node0];
        if (edge_ratio <= original[(int)node0]) {
          dVar18 = edge_ratio;
        }
        original[(int)node0] = dVar18;
        dVar18 = original[RVar11];
        if (edge_ratio <= original[RVar11]) {
          dVar18 = edge_ratio;
        }
        original[RVar11] = dVar18;
      }
      local_e4 = (int)pRVar17;
      if ((long)ref_node->n < 0) {
        pcVar12 = "malloc target of REF_INT negative";
        uStack_100 = 0x75;
        goto LAB_00157473;
      }
      pvVar7 = malloc((long)ref_node->n << 2);
      if (pvVar7 == (void *)0x0) {
        pcVar12 = "malloc target of REF_INT NULL";
        uStack_100 = 0x75;
      }
      else {
        lVar14 = (long)ref_node->max;
        if (lVar14 < 0) {
          pcVar12 = "malloc node2target of REF_INT negative";
          uStack_100 = 0x76;
          goto LAB_00157473;
        }
        local_e0 = pvVar7;
        pvVar7 = malloc(lVar14 * 4);
        if (pvVar7 == (void *)0x0) {
          pcVar12 = "malloc node2target of REF_INT NULL";
          uStack_100 = 0x76;
        }
        else {
          for (lVar6 = 0; lVar14 != lVar6; lVar6 = lVar6 + 1) {
            *(undefined4 *)((long)pvVar7 + lVar6 * 4) = 0xffffffff;
          }
          uVar4 = 0;
          for (lVar6 = 0; lVar14 != lVar6; lVar6 = lVar6 + 1) {
            dVar18 = original[lVar6];
            if (dVar18 < ref_grid->adapt->collapse_ratio) {
              *(uint *)((long)pvVar7 + lVar6 * 4) = uVar4;
              *(int *)((long)local_e0 + (long)(int)uVar4 * 4) = (int)lVar6;
              original[(int)uVar4] = dVar18;
              uVar4 = uVar4 + 1;
            }
          }
          if ((int)uVar4 < 0) {
            pcVar12 = "malloc order of REF_INT negative";
            uStack_100 = 0x81;
            goto LAB_00157473;
          }
          local_c0 = (ulong)uVar4;
          sorted_index = (REF_INT *)malloc(local_c0 * 4);
          if (sorted_index != (REF_INT *)0x0) {
            uVar4 = ref_sort_heap_dbl(uVar4,original,sorted_index);
            if (uVar4 == 0) {
              uVar8 = 0;
              local_c8 = sorted_index;
              do {
                if (uVar8 == local_c0) {
                  free(local_c8);
                  free(pvVar7);
                  free(local_e0);
                  free(original);
                  ref_edge_free(ref_edge);
                  return 0;
                }
                pRVar1 = &ref_grid->adapt->collapse_ratio;
                local_b8 = uVar8;
                if (original[local_c8[uVar8]] < *pRVar1 || original[local_c8[uVar8]] == *pRVar1) {
                  iVar15 = *(int *)((long)local_e0 + (long)local_c8[uVar8] * 4);
                  lVar14 = (long)iVar15;
                  if (((-1 < lVar14) && (iVar15 < ref_node->max)) && (-1 < ref_node->global[lVar14])
                     ) {
                    uVar4 = ref_collapse_to_remove_node1(ref_grid,&local_e4,iVar15);
                    if (uVar4 != 0) {
                      uVar8 = (ulong)uVar4;
                      pcVar12 = "collapse rm";
                      uStack_100 = 0x89;
                      goto LAB_00157385;
                    }
                    if ((ref_node->max <= iVar15) || (ref_node->global[lVar14] < 0)) {
                      lVar14 = (long)local_e4;
                      ref_node->age[lVar14] = 0;
                      RVar11 = -1;
                      iVar15 = -1;
                      if (lVar14 < 0) goto LAB_001577a9;
                      pRVar3 = local_d8->ref_adj;
                      if (pRVar3->nnode <= local_e4) goto LAB_001577a9;
                      iVar16 = pRVar3->first[lVar14];
                      if (iVar16 == -1) goto LAB_001577a9;
                      pRVar9 = pRVar3->item;
                      do {
                        RVar11 = pRVar9[iVar16].ref;
                        iVar15 = iVar16;
LAB_001577a9:
                        do {
                          pRVar2 = local_d8;
                          if (iVar15 == -1) goto LAB_00157750;
                          uVar4 = ref_cell_nodes(local_d8,RVar11,nodes);
                          if (uVar4 != 0) {
                            uVar8 = (ulong)uVar4;
                            pcVar12 = "cell nodes";
                            uStack_100 = 0x8d;
                            goto LAB_00157385;
                          }
                          uVar8 = (ulong)(uint)pRVar2->node_per;
                          if (pRVar2->node_per < 1) {
                            uVar8 = 0;
                          }
                          for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
                            lVar14 = (long)*(int *)((long)pvVar7 + (long)nodes[uVar10] * 4);
                            if (lVar14 != -1) {
                              dVar18 = ref_grid->adapt->collapse_ratio;
                              original[lVar14] = dVar18 + dVar18;
                            }
                          }
                          pRVar9 = local_d8->ref_adj->item;
                          iVar16 = pRVar9[iVar15].next;
                          RVar11 = -1;
                          iVar15 = iVar16;
                        } while (iVar16 == -1);
                      } while( true );
                    }
                  }
                }
LAB_00157750:
                uVar8 = local_b8 + 1;
              } while( true );
            }
            uVar8 = (ulong)uVar4;
            pcVar12 = "sort lengths";
            uStack_100 = 0x83;
            goto LAB_00157385;
          }
          pcVar12 = "malloc order of REF_INT NULL";
          uStack_100 = 0x81;
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           uStack_100,"ref_collapse_pass",pcVar12);
    RVar13 = 2;
  }
  return RVar13;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_pass(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_EDGE ref_edge;
  REF_DBL *ratio;
  REF_INT *order;
  REF_INT ntarget, *target, *node2target;
  REF_INT node, node0, node1;
  REF_INT i, edge;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL edge_ratio;

  if (ref_grid_surf(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc_init(ratio, ref_node_max(ref_node), REF_DBL,
                  2.0 * ref_grid_adapt(ref_grid, collapse_ratio));

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    ratio[node0] = MIN(ratio[node0], edge_ratio);
    ratio[node1] = MIN(ratio[node1], edge_ratio);
  }

  ref_malloc(target, ref_node_n(ref_node), REF_INT);
  ref_malloc_init(node2target, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  ntarget = 0;
  for (node = 0; node < ref_node_max(ref_node); node++)
    if (ratio[node] < ref_grid_adapt(ref_grid, collapse_ratio)) {
      node2target[node] = ntarget;
      target[ntarget] = node;
      ratio[ntarget] = ratio[node];
      ntarget++;
    }

  ref_malloc(order, ntarget, REF_INT);

  RSS(ref_sort_heap_dbl(ntarget, ratio, order), "sort lengths");

  for (i = 0; i < ntarget; i++) {
    if (ratio[order[i]] > ref_grid_adapt(ref_grid, collapse_ratio)) continue;
    node1 = target[order[i]];
    if (!ref_node_valid(ref_node, node1)) continue;
    RSS(ref_collapse_to_remove_node1(ref_grid, &node0, node1), "collapse rm");
    if (!ref_node_valid(ref_node, node1)) {
      ref_node_age(ref_node, node0) = 0;
      each_ref_cell_having_node(ref_cell, node0, item, cell) {
        RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
        for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
          if (REF_EMPTY != node2target[nodes[node]]) {
            ratio[node2target[nodes[node]]] =
                2.0 * ref_grid_adapt(ref_grid, collapse_ratio);
          }
        }
      }
    }
  }

  ref_free(order);
  ref_free(node2target);
  ref_free(target);
  ref_free(ratio);

  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}